

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

quint16 toWindowsIdKey(QByteArray *winId)

{
  long lVar1;
  WindowsData *ba;
  QByteArrayView *this;
  QByteArrayView *pQVar2;
  WindowsData *in_RDI;
  long in_FS_OFFSET;
  WindowsData *data;
  QByteArrayView *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa6;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool bVar3;
  QByteArray *in_stack_ffffffffffffffc0;
  QByteArrayView *pQVar4;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  quint16 qVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ba = std::begin<QtTimeZoneCldr::WindowsData_const,139ul>
                 ((WindowsData (*) [139])&QtTimeZoneCldr::windowsDataTable);
  std::end<QtTimeZoneCldr::WindowsData_const,139ul>
            ((WindowsData (*) [139])&QtTimeZoneCldr::windowsDataTable);
  this = (QByteArrayView *)
         std::
         lower_bound<QtTimeZoneCldr::WindowsData_const*,QByteArray,bool(*)(QtTimeZoneCldr::WindowsData,QByteArrayView)noexcept>
                   ((WindowsData *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                    in_RDI,in_stack_ffffffffffffffc0,
                    (_func_bool_WindowsData_QByteArrayView *)
                    CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  pQVar4 = this;
  pQVar2 = (QByteArrayView *)
           std::end<QtTimeZoneCldr::WindowsData_const,139ul>
                     ((WindowsData (*) [139])&QtTimeZoneCldr::windowsDataTable);
  bVar3 = false;
  if (this != pQVar2) {
    QtTimeZoneCldr::WindowsData::windowsId
              ((WindowsData *)CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0));
    QByteArrayView::QByteArrayView<QByteArray,_true>(this,(QByteArray *)ba);
    bVar3 = operator==((QByteArrayView *)
                       CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
  }
  if (bVar3 == false) {
    qVar5 = 0;
  }
  else {
    qVar5 = *(quint16 *)&pQVar4->m_size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

static quint16 toWindowsIdKey(const QByteArray &winId)
{
    // Key and winId are monotonic, table is sorted on them.
    const auto data = std::lower_bound(std::begin(windowsDataTable), std::end(windowsDataTable),
                                       winId, earlierWindowsId);
    if (data != std::end(windowsDataTable) && data->windowsId() == winId)
        return data->windowsIdKey;
    return 0;
}